

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

ostream * vectorgraphics::operator<<(ostream *out,Point2D *point_2d)

{
  ostream *poVar1;
  Point2D *point_2d_local;
  ostream *out_local;
  
  poVar1 = std::operator<<(out,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,point_2d->x_);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,point_2d->y_);
  std::operator<<(poVar1,") ");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, const Point2D &point_2d) {
    out << "(" << point_2d.x_ << ", " << point_2d.y_ << ") ";
    return out;
  }